

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.cpp
# Opt level: O1

void printBinaryCode(vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> *code,
                    int bitWidth)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  if (0 < bitWidth) {
    iVar1 = 0;
    do {
      dVar3 = ldexp(1.0,bitWidth);
      if (0.0 < dVar3) {
        iVar2 = 0;
        do {
          std::ostream::_M_insert<bool>(true);
          iVar2 = iVar2 + 1;
          dVar3 = ldexp(1.0,bitWidth);
        } while ((double)iVar2 < dVar3);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      iVar1 = iVar1 + 1;
    } while (iVar1 != bitWidth);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void printBinaryCode(const std::vector<std::bitset<20> >& code, int bitWidth)
{
	for(int j = 0; j < bitWidth; ++j)
	{
		for(int i = 0; i < pow(2, bitWidth); i++)
		{
		    std::cout << code[i][j];
		}
		std::cout << std::endl;
	}
	std::cout << std::endl;
}